

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O0

shared_ptr<OpenMD::SPFData> __thiscall OpenMD::Snapshot::getSPFData(Snapshot *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<OpenMD::SPFData> *in_RSI;
  element_type *in_RDI;
  shared_ptr<OpenMD::SPFData> sVar1;
  
  std::shared_ptr<OpenMD::SPFData>::shared_ptr(in_RSI,(shared_ptr<OpenMD::SPFData> *)in_RDI);
  sVar1.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<OpenMD::SPFData>)
         sVar1.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SPFData> Snapshot::getSPFData() { return frameData.spfData; }